

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::containsSeveralSamplerTypes
          (UniformCollection *this)

{
  vector<glu::DataType,_std::allocator<glu::DataType>_> local_28;
  
  getSamplerTypes(&local_28,this);
  if (local_28.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 4 < (ulong)((long)local_28.
                           super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)local_28.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
}

Assistant:

bool containsSeveralSamplerTypes (void) const
	{
		return getSamplerTypes().size() > 1;
	}